

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

GLuint gl4cts::CopyImage::Utils::getPixelSizeForFormat(GLenum internal_format)

{
  TestError *this;
  GLuint local_10;
  GLuint size;
  GLenum internal_format_local;
  
  if (internal_format == 0x2a10) {
    return 1;
  }
  if (internal_format == 0x804f) {
    return 2;
  }
  if (internal_format == 0x8050) {
    return 2;
  }
  if (internal_format == 0x8051) {
    return 3;
  }
  if (internal_format == 0x8052) {
    return 4;
  }
  if (internal_format == 0x8053) {
    return 6;
  }
  if (internal_format == 0x8054) {
    return 6;
  }
  if (internal_format == 0x8055) {
    return 2;
  }
  if (internal_format - 0x8056 < 2) {
LAB_00e4fddd:
    local_10 = 2;
  }
  else {
    if (1 < internal_format - 0x8058) {
      if (internal_format - 0x805a < 2) {
        return 8;
      }
      if (internal_format == 0x8229) {
        return 1;
      }
      if (internal_format - 0x822a < 2) goto LAB_00e4fddd;
      if (internal_format != 0x822c) {
        if (internal_format == 0x822d) goto LAB_00e4fddd;
        if (1 < internal_format - 0x822e) {
          if (internal_format == 0x8230) {
            return 8;
          }
          if (internal_format - 0x8231 < 2) {
            return 1;
          }
          if (internal_format - 0x8233 < 2) goto LAB_00e4fddd;
          if (1 < internal_format - 0x8235) {
            if (internal_format - 0x8237 < 2) goto LAB_00e4fddd;
            if (1 < internal_format - 0x8239) {
              if (internal_format - 0x823b < 2) {
                return 8;
              }
              if (internal_format == 0x8814) {
                return 0x10;
              }
              if (internal_format == 0x8815) {
                return 0xc;
              }
              if (internal_format == 0x881a) {
                return 8;
              }
              if (internal_format == 0x881b) {
                return 6;
              }
              if ((internal_format != 0x8c3a) && (internal_format != 0x8c3d)) {
                if (internal_format == 0x8d70) {
                  return 0x10;
                }
                if (internal_format == 0x8d71) {
                  return 0xc;
                }
                if (internal_format == 0x8d76) {
                  return 8;
                }
                if (internal_format == 0x8d77) {
                  return 6;
                }
                if (internal_format != 0x8d7c) {
                  if (internal_format == 0x8d7d) {
                    return 3;
                  }
                  if (internal_format == 0x8d82) {
                    return 0x10;
                  }
                  if (internal_format == 0x8d83) {
                    return 0xc;
                  }
                  if (internal_format == 0x8d88) {
                    return 8;
                  }
                  if (internal_format == 0x8d89) {
                    return 6;
                  }
                  if (internal_format != 0x8d8e) {
                    if (internal_format == 0x8d8f) {
                      return 3;
                    }
                    if (internal_format == 0x8f94) {
                      return 1;
                    }
                    if (internal_format == 0x8f95) goto LAB_00e4fddd;
                    if (internal_format == 0x8f96) {
                      return 3;
                    }
                    if (internal_format != 0x8f97) {
                      if (internal_format == 0x8f98) goto LAB_00e4fddd;
                      if (internal_format != 0x8f99) {
                        if (internal_format == 0x8f9a) {
                          return 6;
                        }
                        if (internal_format == 0x8f9b) {
                          return 8;
                        }
                        if (internal_format != 0x906f) {
                          this = (TestError *)__cxa_allocate_exception(0x38);
                          tcu::TestError::TestError
                                    (this,"Invalid enum",(char *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                                     ,0x4bb);
                          __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_10 = 4;
  }
  return local_10;
}

Assistant:

GLuint Utils::getPixelSizeForFormat(GLenum internal_format)
{
	GLuint size = 0;

	switch (internal_format)
	{
	/* 8 */
	case GL_R8:
	case GL_R8I:
	case GL_R8UI:
	case GL_R8_SNORM:
	case GL_R3_G3_B2:
		size = 1;
		break;

	/* 8 */
	case GL_RGBA2:
		size = 2;
		break;

	/* 12 */
	case GL_RGB4:
		size = 2;
		break;

	/* 15 */
	case GL_RGB5:
		size = 2;
		break;

	/* 16 */
	case GL_RG8:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG8_SNORM:
	case GL_R16:
	case GL_R16F:
	case GL_R16I:
	case GL_R16UI:
	case GL_R16_SNORM:
	case GL_RGBA4:
	case GL_RGB5_A1:
		size = 2;
		break;

	/* 24 */
	case GL_RGB8:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_RGB8_SNORM:
		size = 3;
		break;

	/* 30 */
	case GL_RGB10:
		size = 4;
		break;

	/* 32 */
	case GL_RGBA8:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGBA8_SNORM:
	case GL_RG16:
	case GL_RG16F:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG16_SNORM:
	case GL_R32F:
	case GL_R32I:
	case GL_R32UI:
	case GL_RGB10_A2:
	case GL_RGB10_A2UI:
	case GL_R11F_G11F_B10F:
	case GL_RGB9_E5:
		size = 4;
		break;

	/* 36 */
	case GL_RGB12:
		size = 6;
		break;

	/* 48 */
	case GL_RGB16:
	case GL_RGB16F:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB16_SNORM:
		size = 6;
		break;

	/* 64 */
	case GL_RGBA12:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA16_SNORM:
	case GL_RG32F:
	case GL_RG32I:
	case GL_RG32UI:
		size = 8;
		break;

	/* 96 */
	case GL_RGB32F:
	case GL_RGB32I:
	case GL_RGB32UI:
		size = 12;
		break;

	/* 128 */
	case GL_RGBA32F:
	case GL_RGBA32I:
	case GL_RGBA32UI:
		size = 16;
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return size;
}